

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O2

void __thiscall
glcts::MultisampleTextureTexStorage2DReconfigurationRejectedTest::deinit
          (MultisampleTextureTexStorage2DReconfigurationRejectedTest *this)

{
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,&this->to_id_2d,0x9100);
  if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,&this->to_id_2d_array,0x9102);
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureTexStorage2DReconfigurationRejectedTest::deinit()
{
	/* Delete texture and bind default texture to GL_TEXTURE_2D_MULTISAMPLE */
	deinitTexture(to_id_2d, GL_TEXTURE_2D_MULTISAMPLE);

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		/* Delete texture and bind default texture to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES */
		deinitTexture(to_id_2d_array, GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES);
	}
	/* Call base class' deinit() */
	TestCase::deinit();
}